

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_iceguy.cpp
# Opt level: O2

int AF_A_IceGuyDie(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  AActor *pAVar3;
  long lVar4;
  char *__assertion;
  AActor *this_00;
  VMValue params [3];
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053f3f9;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = *(AActor **)&param->field_0;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0053f2c9:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053f3f9;
        }
      }
      if (numparam == 1) goto LAB_0053f34a;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053f3e9;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053f3f9;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053f3e9;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053f34a:
        (this_00->Vel).X = 0.0;
        (this_00->Vel).Y = 0.0;
        (this_00->Vel).Z = 0.0;
        pAVar3 = AActor::GetDefault(this_00);
        this_00->Height = pAVar3->Height;
        params[0].field_0._8_4_ = 1;
        params[0].field_0.field_3.Type = '\x03';
        params[1].field_0.field_3.Type = '\x03';
        params[2].field_0.field_1.a = (void *)0x0;
        params[2].field_0.field_1.atag = 8;
        params[2].field_0.field_3.Type = '\x03';
        params[0].field_0._0_8_ = this_00;
        params[1].field_0._0_8_ = this_00;
        params[1].field_0._8_4_ = params[0].field_0._8_4_;
        VMFrameStack::Call(stack,&A_FreezeDeathChunks_VMPtr->super_VMFunction,params,3,
                           (VMReturn *)0x0,0,(VMException **)0x0);
        lVar4 = 0x20;
        do {
          VMValue::~VMValue((VMValue *)((long)&params[0].field_0 + lVar4));
          lVar4 = lVar4 + -0x10;
        } while (lVar4 != -0x10);
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053f3f9;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0053f2c9;
  }
LAB_0053f3e9:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053f3f9:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_iceguy.cpp"
                ,0x65,"int AF_A_IceGuyDie(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_IceGuyDie)
{
	PARAM_ACTION_PROLOGUE;

	self->Vel.Zero();
	self->Height = self->GetDefault()->Height;
	CALL_ACTION(A_FreezeDeathChunks, self);
	return 0;
}